

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

string * el::base::utils::File::extractPathFromFilename(string *fullPath,char *separator)

{
  bool bVar1;
  long lVar2;
  char *in_RDX;
  string *in_RSI;
  string *in_RDI;
  size_t lastSlashAt;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  allocator *paVar3;
  allocator local_21;
  long local_20;
  char *local_18;
  string *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  bVar1 = ::std::operator==(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if ((!bVar1) &&
     (lVar2 = ::std::__cxx11::string::find((char *)local_10,(ulong)local_18), lVar2 != -1)) {
    local_20 = ::std::__cxx11::string::find_last_of((char *)local_10,(ulong)local_18);
    if (local_20 == 0) {
      paVar3 = &local_21;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)in_RDI,local_18,paVar3);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_21);
      return in_RDI;
    }
    ::std::__cxx11::string::substr((ulong)in_RDI,(ulong)local_10);
    return in_RDI;
  }
  ::std::__cxx11::string::string((string *)in_RDI,local_10);
  return in_RDI;
}

Assistant:

std::string File::extractPathFromFilename(const std::string& fullPath, const char* separator) {
  if ((fullPath == "") || (fullPath.find(separator) == std::string::npos)) {
    return fullPath;
  }
  std::size_t lastSlashAt = fullPath.find_last_of(separator);
  if (lastSlashAt == 0) {
    return std::string(separator);
  }
  return fullPath.substr(0, lastSlashAt + 1);
}